

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_context.cpp
# Opt level: O2

void cppcms::http::context::dispatch
               (shared_ptr<cppcms::application_specific_pool> *pool,
               shared_ptr<cppcms::http::context> *self,string *url)

{
  element_type *srv;
  char cVar1;
  level_type lVar2;
  ostream *poVar3;
  intrusive_ptr<cppcms::application> app;
  __shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2> local_60;
  string local_50;
  
  srv = (pool->super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>).
        _M_ptr;
  service((self->super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  application_specific_pool::get((application_specific_pool *)&app,(service *)srv);
  if (app.p_ == (application *)0x0) {
    lVar2 = booster::log::logger::instance();
    cVar1 = booster::log::logger::should_be_logged(lVar2,(char *)0x1e);
    if (cVar1 != '\0') {
      booster::log::message::message
                ((message *)&local_50,error,"cppcms",
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/src/http_context.cpp"
                 ,0x145);
      poVar3 = (ostream *)booster::log::message::out();
      std::operator<<(poVar3,"Cound fetch synchronous application from a pool");
      booster::log::message::~message((message *)&local_50);
    }
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    http::response::make_error_response
              ((response *)
               (((((self->super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->d).ptr_)->response)._M_t.
               super___uniq_ptr_impl<cppcms::http::response,_std::default_delete<cppcms::http::response>_>
               ._M_t.
               super__Tuple_impl<0UL,_cppcms::http::response_*,_std::default_delete<cppcms::http::response>_>
               .super__Head_base<0UL,_cppcms::http::response_*,_false>,500,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    complete_response((self->super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr);
  }
  else {
    std::__shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_60,
               &self->super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>);
    application::assign_context(app.p_,(shared_ptr<cppcms::http::context> *)&local_60);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
    dispatch(&app,url,true);
  }
  booster::intrusive_ptr<cppcms::application>::~intrusive_ptr(&app);
  return;
}

Assistant:

void context::dispatch(booster::shared_ptr<application_specific_pool> const &pool,booster::shared_ptr<context> const &self,std::string const &url)
{
	booster::intrusive_ptr<application> app = pool->get(self->service());
	if(!app) {
		BOOSTER_ERROR("cppcms") << "Cound fetch synchronous application from a pool";
		self->response().make_error_response(http::response::internal_server_error);
		self->complete_response();
		return;
	}
	app->assign_context(self);
	dispatch(app,url,true);
}